

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPAT.cpp
# Opt level: O3

RealType __thiscall OpenMD::NPAT::calcConservedQuantity(NPAT *this)

{
  Thermo *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  SimInfo *this_01;
  RealType RVar7;
  RealType RVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  double *pdVar12;
  uint i;
  long lVar13;
  Mat3x3d *pMVar14;
  double *pdVar15;
  uint j;
  long lVar16;
  Mat3x3d *pMVar17;
  uint k;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  pair<double,_double> pVar21;
  SquareMatrix3<double> result_1;
  SquareMatrix<double,_3> tmp;
  SquareMatrix3<double> result;
  double local_f8 [17];
  double local_70;
  double local_68 [10];
  
  pVar21 = Snapshot::getThermostat
                     ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  (this->super_NPT).thermostat.first = pVar21.first;
  (this->super_NPT).thermostat.second = pVar21.second;
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x18])(this);
  this_01 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_;
  (this->super_NPT).NkBT =
       (double)this_01->nGlobalIntegrableObjects_ * 8.31451e-07 * (this->super_NPT).targetTemp;
  iVar6 = this_01->ndf_;
  iVar11 = SimInfo::getFdf(this_01);
  (this->super_NPT).fkBT = (double)(iVar6 - iVar11) * 8.31451e-07 * (this->super_NPT).targetTemp;
  this_00 = &(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.thermo;
  RVar7 = Thermo::getTotalEnergy(this_00);
  dVar1 = (this->super_NPT).fkBT;
  dVar2 = (this->super_NPT).tt2;
  dVar9 = (this->super_NPT).thermostat.first;
  dVar10 = (this->super_NPT).thermostat.second;
  pdVar12 = local_68;
  local_68[6] = 0.0;
  local_68[7] = 0.0;
  local_68[4] = 0.0;
  local_68[5] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[8] = 0.0;
  lVar13 = 0;
  pMVar14 = &this->eta;
  do {
    lVar16 = 0;
    pdVar15 = pdVar12;
    do {
      *pdVar15 = (pMVar14->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                 [lVar16];
      lVar16 = lVar16 + 1;
      pdVar15 = pdVar15 + 3;
    } while (lVar16 != 3);
    lVar13 = lVar13 + 1;
    pdVar12 = pdVar12 + 1;
    pMVar14 = (Mat3x3d *)
              ((pMVar14->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar13 != 3);
  local_f8[6] = 0.0;
  local_f8[7] = 0.0;
  local_f8[4] = 0.0;
  local_f8[5] = 0.0;
  local_f8[2] = 0.0;
  local_f8[3] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[8] = 0.0;
  pdVar12 = local_68;
  lVar13 = 0;
  do {
    lVar16 = 0;
    pMVar14 = &this->eta;
    do {
      dVar3 = local_f8[lVar13 * 3 + lVar16];
      lVar18 = 0;
      pMVar17 = pMVar14;
      do {
        dVar3 = dVar3 + pdVar12[lVar18] *
                        (pMVar17->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                        data_[0][0];
        lVar18 = lVar18 + 1;
        pMVar17 = (Mat3x3d *)
                  ((pMVar17->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
      } while (lVar18 != 3);
      local_f8[lVar13 * 3 + lVar16] = dVar3;
      lVar16 = lVar16 + 1;
      pMVar14 = (Mat3x3d *)
                ((pMVar14->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                + 1);
    } while (lVar16 != 3);
    lVar13 = lVar13 + 1;
    pdVar12 = pdVar12 + 3;
  } while (lVar13 != 3);
  lVar13 = 0;
  do {
    *(undefined8 *)((long)local_f8 + lVar13 + 0x58) =
         *(undefined8 *)((long)local_f8 + lVar13 + 0x10);
    *(undefined8 *)((long)local_f8 + lVar13 + 0x48) = *(undefined8 *)((long)local_f8 + lVar13);
    *(undefined8 *)((long)local_f8 + lVar13 + 0x50) = *(undefined8 *)((long)local_f8 + lVar13 + 8);
    lVar13 = lVar13 + 0x18;
  } while (lVar13 != 0x48);
  dVar3 = (this->super_NPT).NkBT;
  dVar4 = (this->super_NPT).targetPressure;
  dVar5 = (this->super_NPT).tb2;
  RVar8 = Thermo::getVolume(this_00);
  auVar19._0_8_ = dVar2 * dVar1 * dVar9 * dVar9;
  auVar19._8_8_ = dVar1 * dVar10;
  auVar19 = divpd(auVar19,_DAT_00291e80);
  auVar20._8_8_ = (RVar8 * dVar4) / 163882576.0;
  auVar20._0_8_ = dVar3 * dVar5 * (local_f8[9] + 0.0 + local_f8[0xd] + local_70);
  auVar20 = divpd(auVar20,_DAT_00291e80);
  return auVar20._8_8_ + auVar19._8_8_ + RVar7 + auVar19._0_8_ + auVar20._0_8_;
}

Assistant:

RealType NPAT::calcConservedQuantity() {
    thermostat = snap->getThermostat();
    loadEta();

    // We need NkBT a lot, so just set it here: This is the RAW number
    // of integrableObjects, so no subtraction or addition of constraints or
    // orientational degrees of freedom:
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    // fkBT is used because the thermostat operates on more degrees of freedom
    // than the barostat (when there are particles with orientational degrees
    // of freedom).
    fkBT = info_->getNdf() * Constants::kB * targetTemp;

    RealType conservedQuantity;
    RealType totalEnergy;
    RealType thermostat_kinetic;
    RealType thermostat_potential;
    RealType barostat_kinetic;
    RealType barostat_potential;
    RealType trEta;

    totalEnergy = thermo.getTotalEnergy();

    thermostat_kinetic = fkBT * tt2 * thermostat.first * thermostat.first /
                         (2.0 * Constants::energyConvert);

    thermostat_potential = fkBT * thermostat.second / Constants::energyConvert;

    SquareMatrix<RealType, 3> tmp = eta.transpose() * eta;
    trEta                         = tmp.trace();

    barostat_kinetic = NkBT * tb2 * trEta / (2.0 * Constants::energyConvert);

    barostat_potential =
        (targetPressure * thermo.getVolume() / Constants::pressureConvert) /
        Constants::energyConvert;

    conservedQuantity = totalEnergy + thermostat_kinetic +
                        thermostat_potential + barostat_kinetic +
                        barostat_potential;

    return conservedQuantity;
  }